

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

void curl_formfree(curl_httppost *form)

{
  curl_httppost *pcVar1;
  ulong uVar2;
  
  if (form != (curl_httppost *)0x0) {
    do {
      pcVar1 = form->next;
      if (form->more != (curl_httppost *)0x0) {
        curl_formfree(form->more);
      }
      uVar2 = form->flags;
      if (((uVar2 & 4) == 0) && (form->name != (char *)0x0)) {
        (*Curl_cfree)(form->name);
        uVar2 = form->flags;
      }
      if (((uVar2 & 0x58) == 0) && (form->contents != (char *)0x0)) {
        (*Curl_cfree)(form->contents);
      }
      if (form->contenttype != (char *)0x0) {
        (*Curl_cfree)(form->contenttype);
      }
      if (form->showfilename != (char *)0x0) {
        (*Curl_cfree)(form->showfilename);
      }
      (*Curl_cfree)(form);
      form = pcVar1;
    } while (pcVar1 != (curl_httppost *)0x0);
  }
  return;
}

Assistant:

void curl_formfree(struct curl_httppost *form)
{
  struct curl_httppost *next;

  if(!form)
    /* no form to free, just get out of this */
    return;

  do {
    next=form->next;  /* the following form line */

    /* recurse to sub-contents */
    if(form->more)
      curl_formfree(form->more);

    if(!(form->flags & HTTPPOST_PTRNAME) && form->name)
      free(form->name); /* free the name */
    if(!(form->flags &
         (HTTPPOST_PTRCONTENTS|HTTPPOST_BUFFER|HTTPPOST_CALLBACK)) &&
       form->contents)
      free(form->contents); /* free the contents */
    if(form->contenttype)
      free(form->contenttype); /* free the content type */
    if(form->showfilename)
      free(form->showfilename); /* free the faked file name */
    free(form);       /* free the struct */

  } while((form = next) != NULL); /* continue */
}